

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O2

void duckdb_je_buf_writer_cb(void *buf_writer_arg,char *s)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong __n;
  ulong uVar5;
  
  if (*(long *)((long)buf_writer_arg + 0x10) != 0) {
    sVar1 = strlen(s);
    for (uVar5 = 0; uVar2 = sVar1 - uVar5, uVar5 <= sVar1 && uVar2 != 0; uVar5 = uVar5 + __n) {
      lVar4 = *(long *)((long)buf_writer_arg + 0x18);
      lVar3 = *(long *)((long)buf_writer_arg + 0x20);
      if (lVar3 == lVar4) {
        duckdb_je_buf_writer_flush((buf_writer_t *)buf_writer_arg);
        lVar4 = *(long *)((long)buf_writer_arg + 0x18);
        lVar3 = *(long *)((long)buf_writer_arg + 0x20);
      }
      __n = lVar4 - lVar3;
      if (uVar2 < (ulong)(lVar4 - lVar3)) {
        __n = uVar2;
      }
      switchD_01939fa4::default
                ((void *)(lVar3 + *(long *)((long)buf_writer_arg + 0x10)),s + uVar5,__n);
      *(long *)((long)buf_writer_arg + 0x20) = *(long *)((long)buf_writer_arg + 0x20) + __n;
    }
    return;
  }
  (**buf_writer_arg)(*(undefined8 *)((long)buf_writer_arg + 8),s);
  return;
}

Assistant:

void
buf_writer_cb(void *buf_writer_arg, const char *s) {
	buf_writer_t *buf_writer = (buf_writer_t *)buf_writer_arg;
	buf_writer_assert(buf_writer);
	if (buf_writer->buf == NULL) {
		buf_writer->write_cb(buf_writer->cbopaque, s);
		return;
	}
	size_t i, slen, n;
	for (i = 0, slen = strlen(s); i < slen; i += n) {
		if (buf_writer->buf_end == buf_writer->buf_size) {
			buf_writer_flush(buf_writer);
		}
		size_t s_remain = slen - i;
		size_t buf_remain = buf_writer->buf_size - buf_writer->buf_end;
		n = s_remain < buf_remain ? s_remain : buf_remain;
		memcpy(buf_writer->buf + buf_writer->buf_end, s + i, n);
		buf_writer->buf_end += n;
		buf_writer_assert(buf_writer);
	}
	assert(i == slen);
}